

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_saver_success_example.cpp
# Opt level: O2

void foo3(int *a)

{
  ostream *poVar1;
  saver_success<int> state_saver;
  state_saver<int,_nstd::detail::on_success_policy> local_20;
  
  local_20.policy_.ec_ = std::uncaught_exceptions();
  local_20.previous_value_ = *a;
  *a = 3;
  local_20.previous_ref_ = a;
  poVar1 = std::operator<<((ostream *)&std::cout,"foo3 a = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*a);
  std::endl<char,std::char_traits<char>>(poVar1);
  nstd::detail::state_saver<int,_nstd::detail::on_success_policy>::~state_saver(&local_20);
  return;
}

Assistant:

void foo3(int& a) {
#if defined(__cpp_deduction_guides) && __cpp_deduction_guides >= 201611L
  nstd::saver_success state_saver{a}; // Custom state saver on success, without macros.
#else
  nstd::saver_success<decltype(a)> state_saver{a}; // Custom state saver on success, without macros.
#endif
  a = 3;
  std::cout << "foo3 a = " << a << std::endl;
  // Original state will automatically restored, on scope leave when no exceptions have been thrown.
}